

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

OrphanBuilder * __thiscall
capnp::_::OrphanBuilder::operator=(OrphanBuilder *this,OrphanBuilder *other)

{
  CapTableBuilder *pCVar1;
  
  if (this->segment != (SegmentBuilder *)0x0) {
    euthanize(this);
  }
  pCVar1 = other->capTable;
  this->segment = other->segment;
  this->capTable = pCVar1;
  this->location = other->location;
  (this->tag).content = (other->tag).content;
  other->segment = (SegmentBuilder *)0x0;
  other->location = (word *)0x0;
  return this;
}

Assistant:

inline OrphanBuilder& OrphanBuilder::operator=(OrphanBuilder&& other) {
  // With normal smart pointers, it's important to handle the case where the incoming pointer
  // is actually transitively owned by this one.  In this case, euthanize() would destroy `other`
  // before we copied it.  This isn't possible in the case of `OrphanBuilder` because it only
  // owns message objects, and `other` is not itself a message object, therefore cannot possibly
  // be transitively owned by `this`.

  if (segment != nullptr) euthanize();
  segment = other.segment;
  capTable = other.capTable;
  location = other.location;
  memcpy(&tag, &other.tag, sizeof(tag));  // Needs memcpy to comply with aliasing rules.
  other.segment = nullptr;
  other.location = nullptr;
  return *this;
}